

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O0

void clearvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  Node *pNVar2;
  TValue *pTVar3;
  int iVar4;
  TValue *o;
  int i;
  Node *limit;
  Node *n;
  Table *h;
  GCObject *f_local;
  GCObject *l_local;
  global_State *g_local;
  
  for (f_local = l; f_local != f; f_local = (f_local->h).gclist) {
    pNVar2 = (f_local->h).node;
    bVar1 = (f_local->h).lsizenode;
    for (o._4_4_ = 0; o._4_4_ < (f_local->h).sizearray; o._4_4_ = o._4_4_ + 1) {
      pTVar3 = (f_local->h).array;
      iVar4 = iscleared(g,pTVar3 + o._4_4_);
      if (iVar4 != 0) {
        pTVar3[o._4_4_].tt_ = 0;
      }
    }
    for (limit = (f_local->h).node; limit < pNVar2 + (1 << (bVar1 & 0x1f)); limit = limit + 1) {
      if ((limit->i_val).tt_ != 0) {
        iVar4 = iscleared(g,&limit->i_val);
        if (iVar4 != 0) {
          (limit->i_val).tt_ = 0;
          removeentry(limit);
        }
      }
    }
  }
  return;
}

Assistant:

static void clearvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    int i;
    for (i = 0; i < h->sizearray; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, o))  /* value was collected? */
        setnilvalue(o);  /* remove value */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (!ttisnil(gval(n)) && iscleared(g, gval(n))) {
        setnilvalue(gval(n));  /* remove value ... */
        removeentry(n);  /* and remove entry from table */
      }
    }
  }
}